

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O0

uint64_t vfio_unmap_dma(int fd,uint64_t iova,uint32_t size)

{
  int iVar1;
  uint in_EDX;
  int ret;
  int cfd;
  vfio_iommu_type1_dma_unmap dma_unmap;
  undefined4 local_38;
  undefined4 local_34;
  ulong local_28;
  uint64_t local_8;
  
  local_38 = 0x18;
  local_34 = 3;
  local_28 = (ulong)in_EDX;
  iVar1 = get_vfio_container();
  iVar1 = ioctl(iVar1,0x3b72,&local_38);
  if (iVar1 == -1) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    local_8 = (uint64_t)iVar1;
  }
  return local_8;
}

Assistant:

uint64_t vfio_unmap_dma(int fd, uint64_t iova, uint32_t size) {
	struct vfio_iommu_type1_dma_unmap dma_unmap = {
		.argsz = sizeof(dma_unmap),
		.flags = VFIO_DMA_MAP_FLAG_READ | VFIO_DMA_MAP_FLAG_WRITE,
		.iova = iova,
		.size = size
	};
	int cfd = get_vfio_container();
	int ret = ioctl(cfd, VFIO_IOMMU_UNMAP_DMA, &dma_unmap);
	if (ret == -1) {
		// Failed to unmap DMA region
		return -1;
	}
	return ret;
}